

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeMahonyFilter::updateFilterWithMeasurements
          (AttitudeMahonyFilter *this,LinearAccelerometerMeasurements *linAccMeas,
          GyroscopeMeasurements *gyroMeas)

{
  pointer pcVar1;
  double dVar2;
  Vector3 meas;
  bool bVar3;
  Matrix3x3 S_acc;
  Vector3 linAccMeasUnitVector;
  undefined1 local_a8 [72];
  Vector3 local_60;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  double local_38;
  
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"linear acceleration","");
  bVar3 = checkValidMeasurement(linAccMeas,(string *)local_a8,true);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if (bVar3) {
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"gyroscope","");
    bVar3 = checkValidMeasurement(gyroMeas,(string *)local_a8,false);
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if (bVar3) {
      bVar3 = getUnitVector(linAccMeas,&local_60);
      if (bVar3) {
        meas.m_data[1] = local_60.m_data[1];
        meas.m_data[0] = local_60.m_data[0];
        meas.m_data[2] = local_60.m_data[2];
        getAngVelSkewSymmetricMatrixFromMeasurements
                  ((Matrix3x3 *)local_a8,meas,&this->m_gravity_direction,
                   1.0 - (this->m_params_mahony).confidence_magnetometer_measurements,
                   &this->m_orientationInSO3);
        mapso3ToR3((Matrix3x3 *)local_a8);
        *(undefined4 *)(this->m_omega_mes).m_data = local_48;
        *(uint *)((long)(this->m_omega_mes).m_data + 4) = uStack_44 ^ 0x80000000;
        *(undefined4 *)((this->m_omega_mes).m_data + 1) = uStack_40;
        *(uint *)((long)(this->m_omega_mes).m_data + 0xc) = uStack_3c ^ 0x80000000;
        (this->m_omega_mes).m_data[2] = -local_38;
        (this->m_Omega_y).m_data[2] = gyroMeas->m_data[2];
        dVar2 = gyroMeas->m_data[1];
        (this->m_Omega_y).m_data[0] = gyroMeas->m_data[0];
        (this->m_Omega_y).m_data[1] = dVar2;
        return bVar3;
      }
      iDynTree::reportError
                ("AttitudeMahonyFilter","updateFilterWithMeasurements",
                 "Cannot retrieve unit vector from linear acceleration measuremnts.");
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::updateFilterWithMeasurements(const iDynTree::LinearAccelerometerMeasurements& linAccMeas, const iDynTree::GyroscopeMeasurements& gyroMeas)
{
    using iDynTree::toEigen;

    if (!checkValidMeasurement(linAccMeas, "linear acceleration", true)) { return false; }
    if (!checkValidMeasurement(gyroMeas, "gyroscope", false)) { return false; }

    iDynTree::Vector3 linAccMeasUnitVector;
    if (!getUnitVector(linAccMeas, linAccMeasUnitVector))
    {
        iDynTree::reportError("AttitudeMahonyFilter", "updateFilterWithMeasurements", "Cannot retrieve unit vector from linear acceleration measuremnts.");
        return false;
    }

    iDynTree::Matrix3x3 S_acc = getAngVelSkewSymmetricMatrixFromMeasurements(linAccMeasUnitVector, m_gravity_direction, 1-m_params_mahony.confidence_magnetometer_measurements, m_orientationInSO3);
    toEigen(m_omega_mes) = -toEigen(mapso3ToR3(S_acc));
    m_Omega_y = gyroMeas;

    return true;
}